

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

UInt64 __thiscall Json::Value::asUInt64(Value *this)

{
  bool bVar1;
  ulong uVar2;
  string local_4f0;
  ostringstream local_4d0 [8];
  ostringstream oss_2;
  string local_358;
  ostringstream local_338 [8];
  ostringstream oss_1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream oss;
  Value *this_local;
  
  switch(this->field_0x8) {
  case 0:
    this_local = (Value *)0x0;
    break;
  case 1:
    bVar1 = isUInt64(this);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::operator<<((ostream *)local_190,"LargestInt out of UInt64 range");
      std::__cxx11::ostringstream::str();
      throwLogicError(&local_1c0);
    }
    this_local = (Value *)(this->value_).map_;
    break;
  case 2:
    this_local = (Value *)(this->value_).map_;
    break;
  case 3:
    bVar1 = InRange<int,unsigned_long>((this->value_).real_,0,0xffffffffffffffff);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_338);
      std::operator<<((ostream *)local_338,"double out of UInt64 range");
      std::__cxx11::ostringstream::str();
      throwLogicError(&local_358);
    }
    uVar2 = (ulong)(this->value_).real_;
    this_local = (Value *)(uVar2 | (long)((this->value_).real_ - 9.223372036854776e+18) &
                                   (long)uVar2 >> 0x3f);
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_4d0);
    std::operator<<((ostream *)local_4d0,"Value is not convertible to UInt64.");
    std::__cxx11::ostringstream::str();
    throwLogicError(&local_4f0);
  case 5:
    this_local = (Value *)(long)(int)(uint)(((this->value_).bool_ & 1U) != 0);
  }
  return (UInt64)this_local;
}

Assistant:

Value::UInt64 Value::asUInt64() const {
  switch (type_) {
  case intValue:
    JSON_ASSERT_MESSAGE(isUInt64(), "LargestInt out of UInt64 range");
    return UInt64(value_.int_);
  case uintValue:
    return UInt64(value_.uint_);
  case realValue:
    JSON_ASSERT_MESSAGE(InRange(value_.real_, 0, maxUInt64),
                        "double out of UInt64 range");
    return UInt64(value_.real_);
  case nullValue:
    return 0;
  case booleanValue:
    return value_.bool_ ? 1 : 0;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to UInt64.");
}